

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O3

void __thiscall BarrierTest_ArriveCompletion_Test::TestBody(BarrierTest_ArriveCompletion_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  char *pcVar3;
  int counter;
  barrier<counting_completion> barrier;
  AssertHelper local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Message local_c0 [4];
  int local_9c;
  barrier<counting_completion> local_98;
  
  local_98.completion_.counter = &local_9c;
  local_9c = 0;
  local_98.init_count_ = 2;
  local_98.counter_ = 2;
  local_98.phase_ = 0;
  std::condition_variable::condition_variable(&local_98.cv_);
  local_98.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_98.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_98.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_98.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_98.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e0 = (undefined8 *)0x0;
  local_e8 = &local_d8;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::barrier<counting_completion>::arrive(&local_98,1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  local_c0[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_e8,"counter","0",&local_9c,(int *)local_c0);
  if (local_e8._0_1_ == (internal)0x0) {
    testing::Message::Message(local_c0);
    if (local_e0 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((long *)CONCAT44(local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = local_e0;
  if (local_e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e0 != local_e0 + 2) {
      operator_delete((undefined8 *)*local_e0);
    }
    operator_delete(puVar1);
  }
  local_d8 = 0;
  uStack_d0 = 0;
  local_e0 = (undefined8 *)0x0;
  local_e8 = &local_d8;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::barrier<counting_completion>::arrive(&local_98,1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  local_c0[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_e8,"counter","1",&local_9c,(int *)local_c0);
  if (local_e8._0_1_ == (internal)0x0) {
    testing::Message::Message(local_c0);
    if (local_e0 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((long *)CONCAT44(local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = local_e0;
  if (local_e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e0 != local_e0 + 2) {
      operator_delete((undefined8 *)*local_e0);
    }
    operator_delete(puVar1);
  }
  local_d8 = 0;
  uStack_d0 = 0;
  local_e0 = (undefined8 *)0x0;
  local_e8 = &local_d8;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::barrier<counting_completion>::arrive(&local_98,2);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  local_c0[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_e8,"counter","2",&local_9c,(int *)local_c0);
  if (local_e8._0_1_ == (internal)0x0) {
    testing::Message::Message(local_c0);
    if (local_e0 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_e0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x56,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((long *)CONCAT44(local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_c0[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_c0[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = local_e0;
  if (local_e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_e0 != local_e0 + 2) {
      operator_delete((undefined8 *)*local_e0);
    }
    operator_delete(puVar1);
  }
  std::condition_variable::~condition_variable(&local_98.cv_);
  return;
}

Assistant:

TEST(BarrierTest, ArriveCompletion)
{
  int counter = 0;
  counting_completion complation{&counter};
  yamc::barrier<counting_completion> barrier{2, complation};  // expected count=2
  EXPECT_NO_THROW((void)barrier.arrive());   // c=2->1
  EXPECT_EQ(counter, 0);
  EXPECT_NO_THROW((void)barrier.arrive());   // c=1->0, call completion
  EXPECT_EQ(counter, 1);
  EXPECT_NO_THROW((void)barrier.arrive(2));  // c=2->0, call completion
  EXPECT_EQ(counter, 2);
}